

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void variance_double_1_suite::test_many(void)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  value_type local_70;
  ulong local_68;
  moment_variance<double,_1> filter;
  
  filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
  super_array<double,_1UL>._M_elems[0] = (_Type)0.0;
  filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
  super_span<double,_1UL>.member.size = 0;
  filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
  super_span<double,_1UL>.member.next = 1;
  filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.mean = 0.0;
  filter.sum.variance = 0.0;
  local_70 = 4.94065645841247e-324;
  local_68 = CONCAT44(local_68._4_4_,1);
  filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
  super_span<double,_1UL>.member.data = (pointer)&filter;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ee,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = local_68 & 0xffffffffffffff00;
  local_70._0_1_ =
       filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f0,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             CONCAT71(local_70._1_7_,
                      filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                      super_span<double,_1UL>.member.size == 1);
  local_68 = CONCAT71(local_68._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f1,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
             super_span<double,_1UL>.member.size;
  local_68 = CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f2,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.mean;
  local_68 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,499,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if ((filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size != 0) &&
     (auVar5._8_4_ = (int)(filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.
                           window.super_span<double,_1UL>.member.size >> 0x20),
     auVar5._0_8_ = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                    super_span<double,_1UL>.member.size, auVar5._12_4_ = 0x45300000,
     local_70 = filter.sum.variance /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_1UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_1UL>.member.size) -
                4503599627370496.0)), local_70 <= 0.0)) {
    local_70 = 0.0;
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,500,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if (1 < filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
          super_span<double,_1UL>.member.size) {
    lVar1 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
            super_span<double,_1UL>.member.size - 1;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    local_70 = filter.sum.variance /
               ((auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
    if (local_70 <= 0.0) {
      local_70 = 0.0;
    }
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f5,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push(&filter,2.0);
  local_68 = local_68 & 0xffffffffffffff00;
  local_70._0_1_ =
       filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f7,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             CONCAT71(local_70._1_7_,
                      filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                      super_span<double,_1UL>.member.size == 1);
  local_68 = CONCAT71(local_68._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f8,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
             super_span<double,_1UL>.member.size;
  local_68 = CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f9,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.mean;
  local_68 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fa,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if ((filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size != 0) &&
     (auVar6._8_4_ = (int)(filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.
                           window.super_span<double,_1UL>.member.size >> 0x20),
     auVar6._0_8_ = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                    super_span<double,_1UL>.member.size, auVar6._12_4_ = 0x45300000,
     local_70 = filter.sum.variance /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_1UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_1UL>.member.size) -
                4503599627370496.0)), local_70 <= 0.0)) {
    local_70 = 0.0;
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fb,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if (1 < filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
          super_span<double,_1UL>.member.size) {
    lVar1 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
            super_span<double,_1UL>.member.size - 1;
    auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = 0x45300000;
    local_70 = filter.sum.variance /
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
    if (local_70 <= 0.0) {
      local_70 = 0.0;
    }
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fc,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push(&filter,3.0);
  local_68 = local_68 & 0xffffffffffffff00;
  local_70._0_1_ =
       filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fe,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             CONCAT71(local_70._1_7_,
                      filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                      super_span<double,_1UL>.member.size == 1);
  local_68 = CONCAT71(local_68._1_7_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ff,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = (value_type)
             filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
             super_span<double,_1UL>.member.size;
  local_68 = CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x200,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.mean;
  local_68 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x201,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if ((filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
       super_span<double,_1UL>.member.size != 0) &&
     (auVar7._8_4_ = (int)(filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.
                           window.super_span<double,_1UL>.member.size >> 0x20),
     auVar7._0_8_ = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
                    super_span<double,_1UL>.member.size, auVar7._12_4_ = 0x45300000,
     local_70 = filter.sum.variance /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)filter.
                                       super_basic_moment<double,_1UL,_(trial::online::with)1>.
                                       member.window.super_span<double,_1UL>.member.size) -
                4503599627370496.0)), local_70 <= 0.0)) {
    local_70 = 0.0;
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x202,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  local_70 = 0.0;
  if (1 < filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
          super_span<double,_1UL>.member.size) {
    lVar1 = filter.super_basic_moment<double,_1UL,_(trial::online::with)1>.member.window.
            super_span<double,_1UL>.member.size - 1;
    auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = 0x45300000;
    local_70 = filter.sum.variance /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
    if (local_70 <= 0.0) {
      local_70 = 0.0;
    }
  }
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x203,"void variance_double_1_suite::test_many()",&local_70,&local_68);
  return;
}

Assistant:

void test_many()
{
    window::moment_variance<double, 1> filter;
    TRIAL_TEST_EQ(filter.capacity(), 1);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
}